

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

void bloaty::wasm::ForEachSection<bloaty::wasm::ParseSymbols(bloaty::RangeSink*)::__0>
               (string_view file,anon_class_24_3_64ba70e1 *section_func)

{
  bool bVar1;
  Section section;
  string_view data;
  string_view *in_stack_000000e8;
  Section *section_00;
  anon_class_24_3_64ba70e1 *in_stack_ffffffffffffff80;
  string_view *in_stack_ffffffffffffff88;
  Section local_70;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  
  ReadMagic(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    section_00 = &local_70;
    Section::Read(in_stack_000000e8);
    ParseSymbols::anon_class_24_3_64ba70e1::operator()(in_stack_ffffffffffffff80,section_00);
    Section::~Section((Section *)0x1dd0f9);
  }
  return;
}

Assistant:

void ForEachSection(string_view file, Func&& section_func) {
  string_view data = file;
  ReadMagic(&data);

  while (!data.empty()) {
    Section section = Section::Read(&data);
    section_func(section);
  }
}